

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void diff(istream *oldStream,istream *newStream,ostream *outStream)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> newBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> oldBuffer;
  uint64_t newSize;
  OutZlibStream zlibStream;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  long local_c8;
  bsdiff_stream local_c0;
  OutZlibStream local_a0;
  
  load(&local_e0,oldStream);
  load(&local_f8,newStream);
  local_c8 = (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  std::ostream::write((char *)outStream,(long)&local_c8);
  OutZlibStream::OutZlibStream(&local_a0,outStream);
  local_c0.malloc = malloc;
  local_c0.free = free;
  local_c0.write = write;
  local_c0.opaque = &local_a0;
  bsdiff(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
         local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,&local_c0);
  OutZlibStream::~OutZlibStream(&local_a0);
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void diff(std::istream& oldStream, std::istream& newStream, std::ostream& outStream)
{
	// Load the old and new files in full
	auto oldBuffer = load(oldStream);
	auto newBuffer = load(newStream);

	// Write the size of the new file to the start of the output stream
	std::uint64_t newSize = newBuffer.size();
	outStream.write(reinterpret_cast<char*>(&newSize), sizeof(newSize));

	// Set up the zlib compression stream
	OutZlibStream zlibStream(outStream);

	// Create the diff
	bsdiff_stream bsStream{};
	bsStream.malloc = malloc;
	bsStream.free = free;
	bsStream.write = write;
	bsStream.opaque = &zlibStream;

	bsdiff(oldBuffer.data(), oldBuffer.size(), newBuffer.data(), newBuffer.size(), &bsStream);
}